

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

void __thiscall
helics::Endpoint::Endpoint
          (Endpoint *this,InterfaceVisibility locality,MessageFederate *mFed,string_view name,
          string_view type)

{
  Endpoint *pEVar1;
  
  (this->super_Interface).mCore = (Core *)0x0;
  (this->super_Interface).handle.hid = -1700000000;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  (this->super_Interface).mName._M_string_length = 0;
  (this->super_Interface).mName.field_2._M_local_buf[0] = '\0';
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Endpoint_00482460;
  this->fed = (MessageFederate *)0x0;
  this->referenceIndex = -1;
  this->dataReference = (void *)0x0;
  this->disableAssign = false;
  this->receiveOnly = false;
  (this->defDest)._M_dataplus._M_p = (pointer)&(this->defDest).field_2;
  (this->defDest)._M_string_length = 0;
  (this->defDest).field_2._M_local_buf[0] = '\0';
  if (locality == GLOBAL) {
    pEVar1 = helics::MessageFederate::registerGlobalEndpoint
                       (mFed,(string_view)name,(string_view)type);
  }
  else {
    pEVar1 = helics::MessageFederate::registerEndpoint(mFed,(string_view)name,(string_view)type);
  }
  operator=(this,pEVar1);
  return;
}

Assistant:

Endpoint::Endpoint(InterfaceVisibility locality,
                   MessageFederate* mFed,
                   std::string_view name,
                   std::string_view type)
{
    if (locality == InterfaceVisibility::GLOBAL) {
        operator=(mFed->registerGlobalEndpoint(name, type));
    } else {
        operator=(mFed->registerEndpoint(name, type));
    }
}